

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlHaltParser(xmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlParserInputPtr *ppxVar2;
  xmlParserInputPtr pxVar3;
  xmlParserInputBufferPtr in;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    ctxt->instate = XML_PARSER_EOF;
    ctxt->disableSAX = 1;
    uVar1 = ctxt->inputNr;
    while (1 < (int)uVar1) {
      ctxt->inputNr = uVar1 - 1;
      ppxVar2 = ctxt->inputTab;
      ctxt->input = ppxVar2[(ulong)uVar1 - 2];
      pxVar3 = ppxVar2[(long)(int)uVar1 + -1];
      ppxVar2[(long)(int)uVar1 + -1] = (xmlParserInputPtr)0x0;
      xmlFreeInputStream(pxVar3);
      uVar1 = ctxt->inputNr;
    }
    pxVar3 = ctxt->input;
    if (pxVar3 != (xmlParserInputPtr)0x0) {
      if (pxVar3->free != (xmlParserInputDeallocate)0x0) {
        (*pxVar3->free)(pxVar3->base);
        ctxt->input->free = (xmlParserInputDeallocate)0x0;
      }
      in = ctxt->input->buf;
      if (in != (xmlParserInputBufferPtr)0x0) {
        xmlFreeParserInputBuffer(in);
        ctxt->input->buf = (xmlParserInputBufferPtr)0x0;
      }
      pxVar3 = ctxt->input;
      pxVar3->cur = "";
      pxVar3->length = 0;
      pxVar3->base = "";
      pxVar3->end = "";
    }
  }
  return;
}

Assistant:

static void
xmlHaltParser(xmlParserCtxtPtr ctxt) {
    if (ctxt == NULL)
        return;
    ctxt->instate = XML_PARSER_EOF;
    ctxt->disableSAX = 1;
    while (ctxt->inputNr > 1)
        xmlFreeInputStream(inputPop(ctxt));
    if (ctxt->input != NULL) {
        /*
	 * in case there was a specific allocation deallocate before
	 * overriding base
	 */
        if (ctxt->input->free != NULL) {
	    ctxt->input->free((xmlChar *) ctxt->input->base);
	    ctxt->input->free = NULL;
	}
        if (ctxt->input->buf != NULL) {
            xmlFreeParserInputBuffer(ctxt->input->buf);
            ctxt->input->buf = NULL;
        }
	ctxt->input->cur = BAD_CAST"";
        ctxt->input->length = 0;
	ctxt->input->base = ctxt->input->cur;
        ctxt->input->end = ctxt->input->cur;
    }
}